

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::supervised
          (FastText *this,State *state,real lr,vector<int,_std::allocator<int>_> *line,
          vector<int,_std::allocator<int>_> *labels)

{
  size_type sVar1;
  element_type *peVar2;
  vector<int,_std::allocator<int>_> *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  State *in_RSI;
  uniform_int_distribution<int> *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  Model *in_stack_00000010;
  int32_t i;
  uniform_int_distribution<int> uniform;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uniform_int_distribution<int> *puVar3;
  
  puVar3 = in_RDI;
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  if ((sVar1 != 0) && (sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RDX), sVar1 != 0)) {
    peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x19a9b7);
    if (peVar2->loss == ova) {
      std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x19a9ce);
      Model::update(in_stack_00000010,in_stack_00000008,unaff_retaddr,
                    (int32_t)((ulong)puVar3 >> 0x20),SUB84(puVar3,0),in_RSI);
    }
    else {
      std::vector<int,_std::allocator<int>_>::size(in_RCX);
      std::uniform_int_distribution<int>::uniform_int_distribution
                (in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      std::uniform_int_distribution<int>::operator()
                (in_RDI,(linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x19aa33);
      Model::update(in_stack_00000010,in_stack_00000008,unaff_retaddr,
                    (int32_t)((ulong)puVar3 >> 0x20),SUB84(puVar3,0),in_RSI);
    }
  }
  return;
}

Assistant:

void FastText::supervised(
    Model::State& state,
    real lr,
    const std::vector<int32_t>& line,
    const std::vector<int32_t>& labels) {
  if (labels.size() == 0 || line.size() == 0) {
    return;
  }
  if (args_->loss == loss_name::ova) {
    model_->update(line, labels, Model::kAllLabelsAsTarget, lr, state);
  } else {
    std::uniform_int_distribution<> uniform(0, labels.size() - 1);
    int32_t i = uniform(state.rng);
    model_->update(line, labels, i, lr, state);
  }
}